

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

LY_ERR dict_insert(ly_ctx *ctx,char *value,size_t len,ly_bool zerocopy,char **str_p)

{
  ly_dict_rec *plVar1;
  size_t __n;
  uint32_t hash;
  LY_ERR LVar2;
  char *pcVar3;
  ly_dict_rec *match;
  size_t len_local;
  char **local_48;
  ly_dict_rec rec;
  
  match = (ly_dict_rec *)0x0;
  len_local = len;
  local_48 = str_p;
  ly_log_dbg(1,"inserting \"%.*s\"",len,value);
  hash = lyht_hash(value,len);
  lyht_set_cb_data((ctx->dict).hash_tab,&len_local);
  rec.refcount = 1;
  rec.value = value;
  LVar2 = lyht_insert_with_resize_cb((ctx->dict).hash_tab,&rec,hash,lydict_resize_val_eq,&match);
  __n = len_local;
  plVar1 = match;
  if (LVar2 == LY_SUCCESS) {
    match = plVar1;
    if (zerocopy == '\0') {
      pcVar3 = (char *)malloc(len_local + 1);
      plVar1->value = pcVar3;
      pcVar3 = match->value;
      if (pcVar3 == (char *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","dict_insert");
        return LY_EMEM;
      }
      if (__n == 0) {
        len_local = 0;
      }
      else {
        memcpy(pcVar3,value,__n);
        pcVar3 = match->value;
      }
      pcVar3[len_local] = '\0';
    }
  }
  else {
    if (LVar2 != LY_EEXIST) {
      if (zerocopy == '\0') {
        return LVar2;
      }
      free(value);
      return LVar2;
    }
    match->refcount = match->refcount + 1;
    match = plVar1;
    if (zerocopy != '\0') {
      free(value);
      match = plVar1;
    }
  }
  *local_48 = match->value;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
dict_insert(const struct ly_ctx *ctx, char *value, size_t len, ly_bool zerocopy, const char **str_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct ly_dict_rec *match = NULL, rec;
    uint32_t hash;

    LOGDBG(LY_LDGDICT, "inserting \"%.*s\"", (int)len, value);

    hash = lyht_hash(value, len);
    /* set len as data for compare callback */
    lyht_set_cb_data(ctx->dict.hash_tab, (void *)&len);
    /* create record for lyht_insert */
    rec.value = value;
    rec.refcount = 1;

    ret = lyht_insert_with_resize_cb(ctx->dict.hash_tab, (void *)&rec, hash, lydict_resize_val_eq, (void **)&match);
    if (ret == LY_EEXIST) {
        match->refcount++;
        if (zerocopy) {
            free(value);
        }
        ret = LY_SUCCESS;
    } else if (ret == LY_SUCCESS) {
        if (!zerocopy) {
            /*
             * allocate string for new record
             * record is already inserted in hash table
             */
            match->value = malloc(sizeof *match->value * (len + 1));
            LY_CHECK_ERR_RET(!match->value, LOGMEM(ctx), LY_EMEM);
            if (len) {
                memcpy(match->value, value, len);
            }
            match->value[len] = '\0';
        }
    } else {
        /* lyht_insert returned error */
        if (zerocopy) {
            free(value);
        }
        return ret;
    }

    *str_p = match->value;

    return ret;
}